

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

GLMRegressor_DoubleArray *
google::protobuf::internal::GenericTypeHandler<CoreML::Specification::GLMRegressor_DoubleArray>::New
          (Arena *arena)

{
  Arena *arena_local;
  GLMRegressor_DoubleArray *local_28;
  GLMRegressor_DoubleArray *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (GLMRegressor_DoubleArray *)operator_new(0x28);
    CoreML::Specification::GLMRegressor_DoubleArray::GLMRegressor_DoubleArray(local_28);
  }
  else {
    local_28 = (GLMRegressor_DoubleArray *)
               Arena::AllocateAligned
                         (arena,(type_info *)
                                &CoreML::Specification::GLMRegressor_DoubleArray::typeinfo,0x28);
    CoreML::Specification::GLMRegressor_DoubleArray::GLMRegressor_DoubleArray(local_28);
    Arena::AddListNode(arena,local_28,
                       arena_destruct_object<CoreML::Specification::GLMRegressor_DoubleArray>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }